

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * declaration(C_Parser *parser,C_Token **rest,C_Token *tok,C_Type *basety,VarAttr *attr)

{
  _Bool _Var1;
  C_Type *pCVar2;
  C_Obj *pCVar3;
  char *pcVar4;
  C_VarScope *pCVar5;
  C_Node *pCVar6;
  C_Node *pCVar7;
  C_Node *pCVar8;
  C_Node *pCVar9;
  C_Node *pCVar10;
  C_Node *pCVar11;
  int iVar12;
  int iVar13;
  C_Token *pCVar14;
  C_Token *tok_local;
  int local_184;
  C_Node *local_180;
  VarAttr *local_178;
  C_Token **local_170;
  C_Node *local_168;
  C_Type *local_160;
  C_Node head;
  
  head.var = (C_Obj *)0x0;
  head.val = 0;
  head.fval._0_8_ = 0;
  head._280_8_ = 0;
  head.begin = 0;
  head.end = 0;
  head.asm_str = (char *)0x0;
  head.cas_addr = (C_Node *)0x0;
  head.cas_old = (C_Node *)0x0;
  head.cas_new = (C_Node *)0x0;
  head.atomic_addr = (C_Obj *)0x0;
  head.atomic_expr = (C_Node *)0x0;
  head.args = (C_Node *)0x0;
  head.pass_by_stack = false;
  head._137_7_ = 0;
  head.ret_buffer = (C_Obj *)0x0;
  head.label = (char *)0x0;
  head.unique_label = (char *)0x0;
  head.goto_next = (C_Node *)0x0;
  head.case_next = (C_Node *)0x0;
  head.default_case = (C_Node *)0x0;
  head.els = (C_Node *)0x0;
  head.init = (C_Node *)0x0;
  head.inc = (C_Node *)0x0;
  head.brk_label = (char *)0x0;
  head.cont_label = (char *)0x0;
  head.body = (C_Node *)0x0;
  head.member = (C_Member *)0x0;
  head.func_ty = (C_Type *)0x0;
  head.kind = ND_NULL_EXPR;
  head._4_4_ = 0;
  head.next = (C_Node *)0x0;
  head.ty = (C_Type *)0x0;
  head.tok = (C_Token *)0x0;
  head.lhs = (C_Node *)0x0;
  head.rhs = (C_Node *)0x0;
  head.cond = (C_Node *)0x0;
  head.then = (C_Node *)0x0;
  pCVar9 = &head;
  iVar12 = 0;
  tok_local = tok;
  local_178 = attr;
  local_170 = rest;
  local_160 = basety;
  do {
    while( true ) {
      while( true ) {
        _Var1 = C_equal(tok_local,";");
        pCVar14 = tok_local;
        if (_Var1) {
          pCVar9 = (C_Node *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          pCVar9->kind = ND_BLOCK;
          pCVar9->tok = pCVar14;
          pCVar9->body = head.next;
          *local_170 = tok_local->next;
          return pCVar9;
        }
        iVar13 = iVar12 + -1;
        if (iVar12 != 0) {
          tok_local = C_skip(parser,tok_local,",");
        }
        pCVar2 = declarator(parser,&tok_local,tok_local,local_160);
        pCVar14 = tok_local;
        if (pCVar2->kind == TY_VOID) goto LAB_0012799f;
        if (pCVar2->name == (C_Token *)0x0) {
          pCVar14 = pCVar2->name_pos;
          pcVar4 = "variable name omitted";
          goto LAB_001279c2;
        }
        if ((attr == (VarAttr *)0x0) || (attr->is_static != true)) break;
        pCVar3 = new_anon_gvar(parser,pCVar2);
        pcVar4 = get_ident(parser,pCVar2->name);
        pCVar5 = push_scope(parser,pcVar4);
        pCVar5->var = pCVar3;
        _Var1 = C_equal(tok_local,"=");
        iVar12 = iVar13;
        if (_Var1) {
          gvar_initializer(parser,&tok_local,tok_local->next,pCVar3);
        }
      }
      local_184 = iVar13;
      pCVar6 = compute_vla_size(parser,pCVar2,tok_local);
      pCVar14 = tok_local;
      pCVar7 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar7->kind = ND_EXPR_STMT;
      pCVar7->tok = pCVar14;
      pCVar7->lhs = pCVar6;
      pCVar9->next = pCVar7;
      if (pCVar2->kind != TY_VLA) break;
      _Var1 = C_equal(tok_local,"=");
      if (_Var1) {
        pcVar4 = "variable-sized object may not be initialized";
        pCVar14 = tok_local;
        goto LAB_001279c2;
      }
      pcVar4 = get_ident(parser,pCVar2->name);
      pCVar3 = new_lvar(parser,pcVar4,pCVar2);
      pCVar9 = (C_Node *)pCVar2->name;
      pCVar8 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar8->kind = ND_VLA_PTR;
      pCVar8->tok = (C_Token *)pCVar9;
      pCVar8->var = pCVar3;
      local_180 = pCVar9;
      pCVar9 = new_var_node(parser,pCVar2->vla_size,(C_Token *)pCVar9);
      local_168 = new_var_node(parser,parser->builtin_alloca,pCVar9->tok);
      pCVar14 = pCVar9->tok;
      pCVar10 = (C_Node *)
                (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar10->kind = ND_FUNCALL;
      pCVar10->tok = pCVar14;
      pCVar10->lhs = local_168;
      pCVar2 = parser->builtin_alloca->ty;
      pCVar10->func_ty = pCVar2;
      pCVar10->ty = pCVar2->return_ty;
      pCVar10->args = pCVar9;
      C_add_type(parser,pCVar9);
      pCVar11 = (C_Node *)
                (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar6 = local_180;
      pCVar11->kind = ND_ASSIGN;
      pCVar11->tok = (C_Token *)local_180;
      pCVar11->lhs = pCVar8;
      pCVar11->rhs = pCVar10;
      pCVar9 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar9->kind = ND_EXPR_STMT;
      pCVar9->tok = (C_Token *)pCVar6;
      pCVar9->lhs = pCVar11;
      pCVar7->next = pCVar9;
      attr = local_178;
      iVar12 = local_184;
    }
    pcVar4 = get_ident(parser,pCVar2->name);
    pCVar3 = new_lvar(parser,pcVar4,pCVar2);
    attr = local_178;
    if ((local_178 != (VarAttr *)0x0) && (local_178->align != 0)) {
      pCVar3->align = local_178->align;
    }
    _Var1 = C_equal(tok_local,"=");
    if (_Var1) {
      local_180 = lvar_initializer(parser,&tok_local,tok_local->next,pCVar3);
      pCVar14 = tok_local;
      pCVar9 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar9->kind = ND_EXPR_STMT;
      pCVar9->tok = pCVar14;
      pCVar9->lhs = local_180;
      pCVar7->next = pCVar9;
      pCVar7 = pCVar9;
      attr = local_178;
    }
    if (pCVar3->ty->size < 0) {
      pCVar14 = pCVar2->name;
      pcVar4 = "variable has incomplete type";
      goto LAB_001279c2;
    }
    pCVar9 = pCVar7;
    iVar12 = local_184;
  } while (pCVar3->ty->kind != TY_VOID);
  pCVar14 = pCVar2->name;
LAB_0012799f:
  pcVar4 = "variable declared void";
LAB_001279c2:
  C_error_tok(parser,pCVar14,pcVar4);
}

Assistant:

static C_Node *declaration(C_Parser *parser, C_Token **rest, C_Token *tok, C_Type *basety, VarAttr *attr) {
  C_Node head = {0};
  C_Node *cur = &head;
  int i = 0;

  while (!C_equal(tok, ";")) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    C_Type *ty = declarator(parser, &tok, tok, basety);
    if (ty->kind == TY_VOID)
      C_error_tok(parser, tok, "variable declared void");
    if (!ty->name)
      C_error_tok(parser, ty->name_pos, "variable name omitted");

    if (attr && attr->is_static) {
      // static local variable
      C_Obj *var = new_anon_gvar(parser, ty);
      push_scope(parser, get_ident(parser, ty->name))->var = var;
      if (C_equal(tok, "="))
        gvar_initializer(parser, &tok, tok->next, var);
      continue;
    }

    // Generate code for computing a VLA size. We need to do this
    // even if ty is not VLA because ty may be a pointer to VLA
    // (e.g. int (*foo)[n][m] where n and m are variables.)
    cur = cur->next = new_unary(parser, ND_EXPR_STMT, compute_vla_size(parser, ty, tok), tok);

    if (ty->kind == TY_VLA) {
      if (C_equal(tok, "="))
        C_error_tok(parser, tok, "variable-sized object may not be initialized");

      // Variable length arrays (VLAs) are translated to alloca() calls.
      // For example, `int x[n+2]` is translated to `tmp = n + 2,
      // x = alloca(tmp)`.
      C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
      C_Token *tok = ty->name;
      C_Node *expr = new_binary(parser, ND_ASSIGN, new_vla_ptr(parser, var, tok),
                              new_alloca(parser, new_var_node(parser, ty->vla_size, tok)),
                              tok);

      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
      continue;
    }

    C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
    if (attr && attr->align)
      var->align = attr->align;

    if (C_equal(tok, "=")) {
      C_Node *expr = lvar_initializer(parser, &tok, tok->next, var);
      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
    }

    if (var->ty->size < 0)
      C_error_tok(parser, ty->name, "variable has incomplete type");
    if (var->ty->kind == TY_VOID)
      C_error_tok(parser, ty->name, "variable declared void");
  }

  C_Node *node = new_node(parser, ND_BLOCK, tok);
  node->body = head.next;
  *rest = tok->next;
  return node;
}